

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr *o)

{
  SQObjectType type;
  SQTable *pSVar1;
  SQSharedState *pSVar2;
  SQInteger SVar3;
  SQSharedState *pSVar4;
  SQChar *pSVar5;
  SQUnsignedInteger32 _type;
  SQObjectType local_2c;
  
  local_2c = (o->super_SQObject)._type;
  SVar3 = (*write)(up,&local_2c,4);
  if (SVar3 == 4) {
    type = (o->super_SQObject)._type;
    if ((int)type < 0x5000002) {
      if (type == OT_NULL) {
        return true;
      }
      if (type != OT_BOOL) {
LAB_0013a1e2:
        pSVar5 = IdType2Name(type);
        SQVM::Raise_Error(v,"cannot serialize a %s",pSVar5);
        return false;
      }
    }
    else if (type != OT_INTEGER) {
      if (type == OT_FLOAT) {
        SVar3 = (*write)(up,&(o->super_SQObject)._unVal,4);
        if (SVar3 == 4) {
          return true;
        }
      }
      else {
        if (type != OT_STRING) goto LAB_0013a1e2;
        SVar3 = (*write)(up,&(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).
                             super_SQCollectable._sharedstate,8);
        if ((SVar3 == 8) &&
           (pSVar1 = (o->super_SQObject)._unVal.pTable,
           pSVar2 = (pSVar1->super_SQDelegable).super_SQCollectable._sharedstate,
           pSVar4 = (SQSharedState *)(*write)(up,&pSVar1->_firstfree,(SQInteger)pSVar2),
           pSVar4 == pSVar2)) {
          return true;
        }
      }
      goto LAB_0013a1bf;
    }
    SVar3 = (*write)(up,&(o->super_SQObject)._unVal,8);
    if (SVar3 == 8) {
      return true;
    }
  }
LAB_0013a1bf:
  SQVM::Raise_Error(v,"io error (write function failure)");
  return false;
}

Assistant:

static bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type = (SQUnsignedInteger32)sq_type(o);
    _CHECK_IO(SafeWrite(v,write,up,&_type,sizeof(_type)));
    switch(sq_type(o)){
    case OT_STRING:
        _CHECK_IO(SafeWrite(v,write,up,&_string(o)->_len,sizeof(SQInteger)));
        _CHECK_IO(SafeWrite(v,write,up,_stringval(o),_string(o)->_len));
        break;
    case OT_BOOL:
    case OT_INTEGER:
        _CHECK_IO(SafeWrite(v,write,up,&_integer(o),sizeof(SQInteger)));break;
    case OT_FLOAT:
        _CHECK_IO(SafeWrite(v,write,up,&_float(o),sizeof(SQFloat)));break;
    case OT_NULL:
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),GetTypeName(o));
        return false;
    }
    return true;
}